

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

int vkt::ssbo::anon_unknown_15::computeStd140BaseAlignment(VarType *type,deUint32 layoutFlags)

{
  int iVar1;
  int iVar2;
  DataType DVar3;
  uint uVar4;
  undefined *puVar5;
  pointer pSVar6;
  
  if (type->m_type == TYPE_ARRAY) {
    iVar1 = computeStd140BaseAlignment((type->m_data).array.elementType,layoutFlags);
  }
  else {
    if (type->m_type == TYPE_BASIC) {
      DVar3 = (type->m_data).basic.type;
      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
        if ((layoutFlags & 4) == 0) {
          iVar1 = glu::getDataTypeMatrixNumRows(DVar3);
        }
        else {
          iVar1 = glu::getDataTypeMatrixNumColumns(DVar3);
        }
        DVar3 = glu::getDataTypeFloatVec(iVar1);
        uVar4 = DVar3 - TYPE_FLOAT;
        if (uVar4 < 0x26) {
          puVar5 = &DAT_00b04630;
LAB_0069b848:
          return *(int *)(puVar5 + (ulong)uVar4 * 4);
        }
      }
      else {
        uVar4 = DVar3 - TYPE_FLOAT;
        if (uVar4 < 0x26) {
          puVar5 = &DAT_00b046c8;
          goto LAB_0069b848;
        }
      }
      return 0;
    }
    pSVar6 = (((type->m_data).structPtr)->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pSVar6 == (((type->m_data).structPtr)->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return 0;
    }
    iVar2 = 0;
    do {
      iVar1 = computeStd140BaseAlignment(&pSVar6->m_type,layoutFlags);
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      pSVar6 = pSVar6 + 1;
      iVar2 = iVar1;
    } while (pSVar6 != (((type->m_data).structPtr)->m_members).
                       super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return iVar1 + 0xfU & 0xfffffff0;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type, deUint32 layoutFlags)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			const bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
												 : glu::getDataTypeMatrixNumRows(basicType);
			const int	vecAlign	= deAlign32(getDataTypeByteAlignment(glu::getDataTypeFloatVec(vecSize)), vec4Alignment);

			return vecAlign;
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType(), layoutFlags);

		// Round up to alignment of vec4
		return deAlign32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType(), layoutFlags));

		return deAlign32(maxBaseAlignment, vec4Alignment);
	}
}